

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_of_suite.cpp
# Opt level: O0

void all_map_boolean(void)

{
  bool bVar1;
  basic_variable<std::allocator<char>_> *local_9c0;
  basic_variable<std::allocator<char>_> *local_9a8;
  basic_variable<std::allocator<char>_> *local_990;
  basic_variable<std::allocator<char>_> *local_978;
  basic_variable<std::allocator<char>_> *local_948;
  basic_variable<std::allocator<char>_> *local_930;
  basic_variable<std::allocator<char>_> *local_918;
  basic_variable<std::allocator<char>_> *local_900;
  basic_variable<std::allocator<char>_> *local_8d0;
  basic_variable<std::allocator<char>_> *local_8b8;
  basic_variable<std::allocator<char>_> *local_8a0;
  basic_variable<std::allocator<char>_> *local_888;
  iterator local_858;
  iterator local_840;
  undefined1 local_821;
  basic_variable<std::allocator<char>_> *local_820;
  basic_variable<std::allocator<char>_> local_818;
  basic_variable<std::allocator<char>_> local_7e8;
  undefined1 auStack_7b8 [32];
  basic_variable<std::allocator<char>_> local_798;
  basic_variable<std::allocator<char>_> local_768;
  undefined1 auStack_738 [32];
  basic_variable<std::allocator<char>_> local_718;
  basic_variable<std::allocator<char>_> local_6e8;
  undefined1 auStack_6b8 [32];
  basic_variable<std::allocator<char>_> local_698;
  basic_variable<std::allocator<char>_> local_668;
  basic_variable<std::allocator<char>_> local_638;
  undefined1 local_608 [24];
  variable data_3;
  iterator local_5b8;
  iterator local_5a0;
  undefined1 local_581;
  basic_variable<std::allocator<char>_> *local_580;
  basic_variable<std::allocator<char>_> local_578;
  basic_variable<std::allocator<char>_> local_548;
  undefined1 auStack_518 [32];
  basic_variable<std::allocator<char>_> local_4f8;
  basic_variable<std::allocator<char>_> local_4c8;
  undefined1 auStack_498 [32];
  basic_variable<std::allocator<char>_> local_478;
  basic_variable<std::allocator<char>_> local_448;
  undefined1 auStack_418 [32];
  basic_variable<std::allocator<char>_> local_3f8;
  basic_variable<std::allocator<char>_> local_3c8;
  basic_variable<std::allocator<char>_> local_398;
  undefined1 local_368 [24];
  variable data_2;
  iterator local_318;
  iterator local_300;
  undefined1 local_2e1;
  basic_variable<std::allocator<char>_> *local_2e0;
  basic_variable<std::allocator<char>_> local_2d8;
  basic_variable<std::allocator<char>_> local_2a8;
  undefined1 auStack_278 [32];
  basic_variable<std::allocator<char>_> local_258;
  basic_variable<std::allocator<char>_> local_228;
  undefined1 auStack_1f8 [32];
  basic_variable<std::allocator<char>_> local_1d8;
  basic_variable<std::allocator<char>_> local_1a8;
  undefined1 auStack_178 [32];
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  basic_variable<std::allocator<char>_> local_f8;
  undefined1 local_c8 [24];
  variable data_1;
  iterator local_78;
  iterator local_50;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_50,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_78,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = std::all_of<trial::dynamic::basic_variable<std::allocator<char>>::iterator,__0>
                    (&local_50,&local_78);
  boost::detail::test_impl
            ("std::all_of(data.begin(), data.end(), is_true)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/all_of_suite.cpp"
             ,0x9a,"void all_map_boolean()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  local_2e1 = 1;
  auStack_178._24_8_ = &local_158;
  auStack_1f8._24_8_ = &local_1d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_1f8._24_8_,"alpha");
  auStack_1f8._24_8_ = &local_1a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)auStack_1f8._24_8_,false);
  auStack_178._8_8_ = &local_1d8;
  auStack_178._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_158,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_178 + 8));
  auStack_278._24_8_ = &local_258;
  auStack_178._24_8_ = &local_128;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_278._24_8_,"bravo");
  auStack_278._24_8_ = &local_228;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)auStack_278._24_8_,false);
  auStack_1f8._8_8_ = &local_258;
  auStack_1f8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_128,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_1f8 + 8));
  local_2e0 = &local_2d8;
  auStack_178._24_8_ = &local_f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_2e0,"charlie");
  local_2e0 = &local_2a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_2e0,false);
  auStack_278._8_8_ = &local_2d8;
  auStack_278._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_f8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_278 + 8));
  local_2e1 = 0;
  local_c8._0_8_ = &local_158;
  local_c8._8_8_ = 3;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_c8 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_c8);
  local_888 = (basic_variable<std::allocator<char>_> *)local_c8;
  do {
    local_888 = local_888 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_888);
  } while (local_888 != &local_158);
  local_8a0 = (basic_variable<std::allocator<char>_> *)auStack_278;
  do {
    local_8a0 = local_8a0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_8a0);
  } while (local_8a0 != &local_2d8);
  local_8b8 = (basic_variable<std::allocator<char>_> *)auStack_1f8;
  do {
    local_8b8 = local_8b8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_8b8);
  } while (local_8b8 != &local_258);
  local_8d0 = (basic_variable<std::allocator<char>_> *)auStack_178;
  do {
    local_8d0 = local_8d0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_8d0);
  } while (local_8d0 != &local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_300,(basic_variable<std::allocator<char>_> *)(local_c8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_318,(basic_variable<std::allocator<char>_> *)(local_c8 + 0x10));
  bVar1 = std::all_of<trial::dynamic::basic_variable<std::allocator<char>>::iterator,__0>
                    (&local_300,&local_318);
  boost::detail::test_impl
            ("!std::all_of(data.begin(), data.end(), is_true)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/all_of_suite.cpp"
             ,0xa3,"void all_map_boolean()",(bool)(~bVar1 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_c8 + 0x10));
  local_581 = 1;
  auStack_418._24_8_ = &local_3f8;
  auStack_498._24_8_ = &local_478;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_498._24_8_,"alpha");
  auStack_498._24_8_ = &local_448;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)auStack_498._24_8_,true);
  auStack_418._8_8_ = &local_478;
  auStack_418._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_3f8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_418 + 8));
  auStack_518._24_8_ = &local_4f8;
  auStack_418._24_8_ = &local_3c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_518._24_8_,"bravo");
  auStack_518._24_8_ = &local_4c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)auStack_518._24_8_,false);
  auStack_498._8_8_ = &local_4f8;
  auStack_498._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_3c8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_498 + 8));
  local_580 = &local_578;
  auStack_418._24_8_ = &local_398;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_580,"charlie");
  local_580 = &local_548;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_580,true);
  auStack_518._8_8_ = &local_578;
  auStack_518._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_398,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_518 + 8));
  local_581 = 0;
  local_368._0_8_ = &local_3f8;
  local_368._8_8_ = 3;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_368 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_368);
  local_900 = (basic_variable<std::allocator<char>_> *)local_368;
  do {
    local_900 = local_900 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_900);
  } while (local_900 != &local_3f8);
  local_918 = (basic_variable<std::allocator<char>_> *)auStack_518;
  do {
    local_918 = local_918 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_918);
  } while (local_918 != &local_578);
  local_930 = (basic_variable<std::allocator<char>_> *)auStack_498;
  do {
    local_930 = local_930 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_930);
  } while (local_930 != &local_4f8);
  local_948 = (basic_variable<std::allocator<char>_> *)auStack_418;
  do {
    local_948 = local_948 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_948);
  } while (local_948 != &local_478);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5a0,(basic_variable<std::allocator<char>_> *)(local_368 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_5b8,(basic_variable<std::allocator<char>_> *)(local_368 + 0x10));
  bVar1 = std::all_of<trial::dynamic::basic_variable<std::allocator<char>>::iterator,__0>
                    (&local_5a0,&local_5b8);
  boost::detail::test_impl
            ("!std::all_of(data.begin(), data.end(), is_true)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/all_of_suite.cpp"
             ,0xac,"void all_map_boolean()",(bool)(~bVar1 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_368 + 0x10));
  local_821 = 1;
  auStack_6b8._24_8_ = &local_698;
  auStack_738._24_8_ = &local_718;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_738._24_8_,"alpha");
  auStack_738._24_8_ = &local_6e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)auStack_738._24_8_,true);
  auStack_6b8._8_8_ = &local_718;
  auStack_6b8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_698,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_6b8 + 8));
  auStack_7b8._24_8_ = &local_798;
  auStack_6b8._24_8_ = &local_668;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_7b8._24_8_,"bravo");
  auStack_7b8._24_8_ = &local_768;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)auStack_7b8._24_8_,true);
  auStack_738._8_8_ = &local_798;
  auStack_738._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_668,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_738 + 8));
  local_820 = &local_818;
  auStack_6b8._24_8_ = &local_638;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_820,"charlie");
  local_820 = &local_7e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_820,true);
  auStack_7b8._8_8_ = &local_818;
  auStack_7b8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_638,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_7b8 + 8));
  local_821 = 0;
  local_608._0_8_ = &local_698;
  local_608._8_8_ = 3;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_608 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_608);
  local_978 = (basic_variable<std::allocator<char>_> *)local_608;
  do {
    local_978 = local_978 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_978);
  } while (local_978 != &local_698);
  local_990 = (basic_variable<std::allocator<char>_> *)auStack_7b8;
  do {
    local_990 = local_990 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_990);
  } while (local_990 != &local_818);
  local_9a8 = (basic_variable<std::allocator<char>_> *)auStack_738;
  do {
    local_9a8 = local_9a8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9a8);
  } while (local_9a8 != &local_798);
  local_9c0 = (basic_variable<std::allocator<char>_> *)auStack_6b8;
  do {
    local_9c0 = local_9c0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9c0);
  } while (local_9c0 != &local_718);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_840,(basic_variable<std::allocator<char>_> *)(local_608 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_858,(basic_variable<std::allocator<char>_> *)(local_608 + 0x10));
  bVar1 = std::all_of<trial::dynamic::basic_variable<std::allocator<char>>::iterator,__0>
                    (&local_840,&local_858);
  boost::detail::test_impl
            ("std::all_of(data.begin(), data.end(), is_true)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/all_of_suite.cpp"
             ,0xb5,"void all_map_boolean()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_840);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_608 + 0x10));
  return;
}

Assistant:

void all_map_boolean()
{
    {
        variable data = map::make();
        TRIAL_PROTOCOL_TEST(std::all_of(data.begin(), data.end(), is_true));
    }
    {
        variable data =
            {
                { "alpha", false },
                { "bravo", false },
                { "charlie", false }
            };
        TRIAL_PROTOCOL_TEST(!std::all_of(data.begin(), data.end(), is_true));
    }
    {
        variable data =
            {
                { "alpha", true },
                { "bravo", false },
                { "charlie", true }
            };
        TRIAL_PROTOCOL_TEST(!std::all_of(data.begin(), data.end(), is_true));
    }
    {
        variable data =
            {
                { "alpha", true },
                { "bravo", true },
                { "charlie", true }
            };
        TRIAL_PROTOCOL_TEST(std::all_of(data.begin(), data.end(), is_true));
    }
}